

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall glslang::HlslParseContext::paramFix(HlslParseContext *this,TType *type)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar5;
  long lVar6;
  long lVar7;
  TQualifier *pTVar8;
  HlslParseContext *pHVar9;
  TQualifier *pTVar10;
  undefined8 *puVar11;
  byte bVar12;
  TQualifier TStack_78;
  
  bVar12 = 0;
  iVar3 = (*type->_vptr_TType[10])(type);
  uVar4 = *(uint *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f;
  if (uVar4 < 2) {
    iVar3 = (*type->_vptr_TType[10])(type);
    lVar7 = CONCAT44(extraout_var_01,iVar3);
    uVar5 = *(ulong *)(lVar7 + 8) & 0xffffffffffffff80 | 0x10;
  }
  else {
    if (uVar4 == 6) {
      pHVar9 = (HlslParseContext *)type;
      iVar3 = (*type->_vptr_TType[10])();
      correctUniform(pHVar9,(TQualifier *)CONCAT44(extraout_var_02,iVar3));
      lVar7 = 10;
      pTVar8 = &this->globalBufferDefaults;
      pTVar10 = &TStack_78;
      for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
        pTVar10->semanticName = pTVar8->semanticName;
        pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar12 * -0x10 + 8);
        pTVar10 = (TQualifier *)((long)pTVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      pHVar9 = (HlslParseContext *)type;
      iVar3 = (*type->_vptr_TType[10])();
      mergeObjectLayoutQualifiers
                (pHVar9,&TStack_78,(TQualifier *)CONCAT44(extraout_var_03,iVar3),true);
      iVar3 = (*type->_vptr_TType[10])(type);
      uVar1 = *(undefined8 *)(CONCAT44(extraout_var_04,iVar3) + 8);
      iVar3 = (*type->_vptr_TType[10])(type);
      uVar5 = *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 8);
      iVar3 = (*type->_vptr_TType[10])(type);
      uVar2 = *(ulong *)(CONCAT44(extraout_var_06,iVar3) + 8);
      iVar3 = (*type->_vptr_TType[10])(type);
      TStack_78._8_8_ =
           (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_07,iVar3) + 8) & 0x1ff0000) |
           uVar2 & 0x2000000000000 |
           uVar5 & 0x800000000000 |
           TStack_78._8_8_ & 0xfffd7ffffe00ff80 | (ulong)((uint)uVar1 & 0x7f);
      iVar3 = (*type->_vptr_TType[10])(type);
      pTVar8 = &TStack_78;
      puVar11 = (undefined8 *)CONCAT44(extraout_var_08,iVar3);
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar11 = pTVar8->semanticName;
        pTVar8 = (TQualifier *)((long)pTVar8 + ((ulong)bVar12 * -2 + 1) * 8);
        puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
      }
      return;
    }
    if (uVar4 != 2) {
      return;
    }
    iVar3 = (*type->_vptr_TType[10])(type);
    lVar7 = CONCAT44(extraout_var_00,iVar3);
    uVar5 = *(ulong *)(lVar7 + 8) & 0xffffffffffffff80 | 0x13;
  }
  *(ulong *)(lVar7 + 8) = uVar5;
  return;
}

Assistant:

void HlslParseContext::paramFix(TType& type)
{
    switch (type.getQualifier().storage) {
    case EvqConst:
        type.getQualifier().storage = EvqConstReadOnly;
        break;
    case EvqGlobal:
    case EvqTemporary:
        type.getQualifier().storage = EvqIn;
        break;
    case EvqBuffer:
        {
            // SSBO parameter.  These do not go through the declareBlock path since they are fn parameters.
            correctUniform(type.getQualifier());
            TQualifier bufferQualifier = globalBufferDefaults;
            mergeObjectLayoutQualifiers(bufferQualifier, type.getQualifier(), true);
            bufferQualifier.storage = type.getQualifier().storage;
            bufferQualifier.readonly = type.getQualifier().readonly;
            bufferQualifier.coherent = type.getQualifier().coherent;
            bufferQualifier.declaredBuiltIn = type.getQualifier().declaredBuiltIn;
            type.getQualifier() = bufferQualifier;
            break;
        }
    default:
        break;
    }
}